

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_drop.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalDrop::GetData
          (PhysicalDrop *this,ExecutionContext *context,DataChunk *chunk,OperatorSourceInput *input)

{
  char cVar1;
  ClientContext *pCVar2;
  __type _Var3;
  pointer pDVar4;
  ClientData *pCVar5;
  iterator iVar6;
  pointer pEVar7;
  SecretManager *this_00;
  pointer pDVar8;
  pointer this_01;
  CatalogSearchEntry *__rhs;
  Catalog *pCVar9;
  type pDVar10;
  unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *this_02;
  Value VStack_68;
  
  this_02 = &this->info;
  pDVar4 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     (this_02);
  cVar1 = (pDVar4->super_ParseInfo).field_0x9;
  if (cVar1 == '\x02') {
    pCVar2 = context->client;
    pDVar4 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (this_02);
    pCVar9 = Catalog::GetCatalog(pCVar2,&pDVar4->catalog);
    pCVar2 = context->client;
    pDVar10 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator*
                        (this_02);
    Catalog::DropEntry(pCVar9,pCVar2,pDVar10);
    pCVar5 = ClientData::Get(context->client);
    this_01 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
              ::operator->(&pCVar5->catalog_search_path);
    __rhs = CatalogSearchPath::GetDefault(this_01);
    pDVar4 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (this_02);
    _Var3 = ::std::operator==(&pDVar4->catalog,&__rhs->catalog);
    if (_Var3) {
      pDVar4 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_02);
      _Var3 = ::std::operator==(&__rhs->schema,&pDVar4->name);
      if (_Var3) {
        pCVar2 = context->client;
        Value::Value(&VStack_68,"main");
        SchemaSetting::SetLocal(pCVar2,&VStack_68);
        Value::~Value(&VStack_68);
      }
    }
  }
  else if (cVar1 == 'G') {
    pDVar4 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (this_02);
    pEVar7 = unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>,_true>::
             operator->(&pDVar4->extra_drop_info);
    this_00 = SecretManager::Get(context->client);
    pCVar2 = context->client;
    pDVar4 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (this_02);
    pDVar8 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (this_02);
    SecretManager::DropSecretByName
              (this_00,pCVar2,&pDVar4->name,pDVar8->if_not_found,pEVar7->field_0x9,
               (string *)(pEVar7 + 1));
  }
  else if (cVar1 == '\x05') {
    pCVar5 = ClientData::Get(context->client);
    pDVar4 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (this_02);
    iVar6 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(pCVar5->prepared_statements)._M_h,&pDVar4->name);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      pDVar4 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_02);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&(pCVar5->prepared_statements)._M_h,&pDVar4->name);
    }
  }
  else {
    pCVar2 = context->client;
    pDVar4 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (this_02);
    pCVar9 = Catalog::GetCatalog(pCVar2,&pDVar4->catalog);
    pCVar2 = context->client;
    pDVar10 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator*
                        (this_02);
    Catalog::DropEntry(pCVar9,pCVar2,pDVar10);
  }
  return FINISHED;
}

Assistant:

SourceResultType PhysicalDrop::GetData(ExecutionContext &context, DataChunk &chunk, OperatorSourceInput &input) const {
	switch (info->type) {
	case CatalogType::PREPARED_STATEMENT: {
		// DEALLOCATE silently ignores errors
		auto &statements = ClientData::Get(context.client).prepared_statements;
		if (statements.find(info->name) != statements.end()) {
			statements.erase(info->name);
		}
		break;
	}
	case CatalogType::SCHEMA_ENTRY: {
		auto &catalog = Catalog::GetCatalog(context.client, info->catalog);
		catalog.DropEntry(context.client, *info);

		// Check if the dropped schema was set as the current schema
		auto &client_data = ClientData::Get(context.client);
		auto &default_entry = client_data.catalog_search_path->GetDefault();
		auto &current_catalog = default_entry.catalog;
		auto &current_schema = default_entry.schema;
		D_ASSERT(info->name != DEFAULT_SCHEMA);

		if (info->catalog == current_catalog && current_schema == info->name) {
			// Reset the schema to default
			SchemaSetting::SetLocal(context.client, DEFAULT_SCHEMA);
		}
		break;
	}
	case CatalogType::SECRET_ENTRY: {
		// Note: the schema param is used to optionally pass the storage to drop from
		D_ASSERT(info->extra_drop_info);
		auto &extra_info = info->extra_drop_info->Cast<ExtraDropSecretInfo>();
		SecretManager::Get(context.client)
		    .DropSecretByName(context.client, info->name, info->if_not_found, extra_info.persist_mode,
		                      extra_info.secret_storage);
		break;
	}
	default: {
		auto &catalog = Catalog::GetCatalog(context.client, info->catalog);
		catalog.DropEntry(context.client, *info);
		break;
	}
	}

	return SourceResultType::FINISHED;
}